

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_rest_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  CURLcode CVar1;
  char buffer [24];
  char local_28 [24];
  
  if (instate == FTP_RETR_REST) {
    if (ftpcode == 0x15e) {
      CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"RETR %s",(conn->proto).ftpc.file);
      if (CVar1 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_RETR;
        CVar1 = CURLE_OK;
      }
    }
    else {
      Curl_failf(conn->data,"Couldn\'t use REST");
      CVar1 = CURLE_FTP_COULDNT_USE_REST;
    }
  }
  else {
    if (ftpcode == 0x15e) {
      builtin_strncpy(local_28,"Accept-ranges: bytes\r\n",0x17);
      local_28[0x17] = '\0';
      CVar1 = Curl_client_write(conn,3,local_28,0);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    CVar1 = ftp_state_prepare_transfer(conn);
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_state_rest_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(instate) {
  case FTP_REST:
  default:
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(ftpcode == 350) {
      char buffer[24]= { "Accept-ranges: bytes\r\n" };
      result = Curl_client_write(conn, CLIENTWRITE_BOTH, buffer, 0);
      if(result)
        return result;
    }
#endif
    result = ftp_state_prepare_transfer(conn);
    break;

  case FTP_RETR_REST:
    if(ftpcode != 350) {
      failf(conn->data, "Couldn't use REST");
      result = CURLE_FTP_COULDNT_USE_REST;
    }
    else {
      PPSENDF(&ftpc->pp, "RETR %s", ftpc->file);
      state(conn, FTP_RETR);
    }
    break;
  }

  return result;
}